

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void add_stub(compiler_common *common,sljit_jump *start)

{
  sljit_compiler *compiler_00;
  stub_list *psVar1;
  sljit_label *psVar2;
  stub_list *list_item;
  sljit_compiler *compiler;
  sljit_jump *start_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  psVar1 = (stub_list *)sljit_alloc_memory(compiler_00,0x18);
  if (psVar1 != (stub_list *)0x0) {
    psVar1->start = start;
    psVar2 = sljit_emit_label(compiler_00);
    psVar1->quit = psVar2;
    psVar1->next = common->stubs;
    common->stubs = psVar1;
  }
  return;
}

Assistant:

static void add_stub(compiler_common *common, struct sljit_jump *start)
{
DEFINE_COMPILER;
stub_list *list_item = sljit_alloc_memory(compiler, sizeof(stub_list));

if (list_item)
  {
  list_item->start = start;
  list_item->quit = LABEL();
  list_item->next = common->stubs;
  common->stubs = list_item;
  }
}